

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_v7tar.c
# Opt level: O0

int is_null(char *p,size_t l)

{
  size_t local_20;
  size_t l_local;
  char *p_local;
  
  local_20 = l;
  l_local = (size_t)p;
  while( true ) {
    if (local_20 == 0) {
      return 1;
    }
    if (*(char *)l_local != '\0') break;
    local_20 = local_20 - 1;
    l_local = l_local + 1;
  }
  return 0;
}

Assistant:

static int
is_null(const char *p, size_t l)
{
	while (l > 0) {
		if (*p != '\0')
			return (0);
		--l;
		++p;
	}
	return (1);
}